

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

void __thiscall
pdqsort_detail::
pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1,false>
          (pdqsort_detail *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
          anon_class_16_2_fd512ddf comp,int bad_allowed,bool leftmost)

{
  HighsInt *pHVar1;
  pdqsort_detail *ppVar2;
  int iVar3;
  HighsInt HVar4;
  HighsInt HVar5;
  undefined4 uVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  HighsInt *pHVar11;
  _DistanceType __len;
  ulong uVar12;
  uint uVar13;
  HighsCutGeneration *pHVar14;
  undefined4 in_register_0000008c;
  HighsInt *pHVar15;
  pdqsort_detail *this_00;
  long lVar16;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var17;
  pdqsort_detail *ppVar18;
  long lVar19;
  int *piVar20;
  anon_class_16_2_fd512ddf comp_00;
  anon_class_16_2_fd512ddf comp_01;
  anon_class_16_2_fd512ddf comp_02;
  anon_class_16_2_fd512ddf comp_03;
  anon_class_16_2_fd512ddf comp_04;
  anon_class_16_2_fd512ddf comp_05;
  anon_class_16_2_fd512ddf comp_06;
  anon_class_16_2_fd512ddf comp_07;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCutGeneration_cpp:61:13)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCutGeneration_cpp:61:13)>
  __comp_00;
  uint local_a4;
  anon_class_16_2_fd512ddf local_80;
  int *local_70;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  pdqsort_detail *local_48;
  anon_class_16_2_fd512ddf comp_local;
  
  pHVar15 = (HighsInt *)CONCAT44(in_register_0000008c,bad_allowed);
  comp_00.this = comp.this;
  uVar13 = (uint)comp.r;
  local_68._M_current = begin._M_current + -1;
  local_50._M_current = begin._M_current + -2;
  local_58._M_current = begin._M_current + -3;
  comp_local.this = (HighsCutGeneration *)end._M_current;
  comp_local.r = (HighsInt *)comp_00.this;
  local_a4 = bad_allowed;
LAB_0029442f:
  do {
    local_70 = begin._M_current - (long)this;
    uVar12 = (long)local_70 >> 2;
    if ((long)uVar12 < 0x18) {
      if ((local_a4 & 1) == 0) {
        if (this != (pdqsort_detail *)begin._M_current) {
          local_80.this = (HighsCutGeneration *)end._M_current;
          local_80.r = (HighsInt *)comp_00.this;
          while (pHVar15 = (HighsInt *)((long)this + 4), pHVar15 != begin._M_current) {
            bVar8 = HighsCutGeneration::determineCover::anon_class_16_2_fd512ddf::operator()
                              (&local_80,*(HighsInt *)((long)this + 4),*(HighsInt *)this);
            this = (pdqsort_detail *)pHVar15;
            if (bVar8) {
              HVar4 = *pHVar15;
              do {
                pHVar11 = pHVar15 + -2;
                *pHVar15 = pHVar15[-1];
                pHVar15 = pHVar15 + -1;
                bVar8 = HighsCutGeneration::determineCover::anon_class_16_2_fd512ddf::operator()
                                  (&local_80,HVar4,*pHVar11);
              } while (bVar8);
              *pHVar15 = HVar4;
            }
          }
        }
      }
      else if (this != (pdqsort_detail *)begin._M_current) {
        lVar16 = 4;
        _Var17._M_current = (int *)this;
        local_80.this = (HighsCutGeneration *)end._M_current;
        local_80.r = (HighsInt *)comp_00.this;
        while (pHVar15 = _Var17._M_current + 1, pHVar15 != begin._M_current) {
          bVar8 = HighsCutGeneration::determineCover::anon_class_16_2_fd512ddf::operator()
                            (&local_80,_Var17._M_current[1],*_Var17._M_current);
          if (bVar8) {
            HVar4 = *pHVar15;
            lVar19 = lVar16;
            do {
              *(undefined4 *)((long)this + lVar19) = *(undefined4 *)((long)this + lVar19 + -4);
              _Var17._M_current = (int *)this;
              if (lVar19 == 4) goto LAB_00294942;
              bVar8 = HighsCutGeneration::determineCover::anon_class_16_2_fd512ddf::operator()
                                (&local_80,HVar4,*(HighsInt *)((long)this + lVar19 + -8));
              lVar19 = lVar19 + -4;
            } while (bVar8);
            _Var17._M_current = (HighsInt *)(lVar19 + (long)this);
LAB_00294942:
            *_Var17._M_current = HVar4;
          }
          lVar16 = lVar16 + 4;
          _Var17._M_current = pHVar15;
        }
      }
      return;
    }
    uVar10 = uVar12 >> 1;
    _Var17._M_current = (int *)((long)this + uVar10 * 4);
    pHVar14 = comp_00.this;
    if (uVar12 < 0x81) {
      comp_07.r = pHVar15;
      comp_07.this = comp_00.this;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                ((pdqsort_detail *)_Var17._M_current,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this,local_68,
                 end,comp_07);
    }
    else {
      comp_03.r = pHVar15;
      comp_03.this = comp_00.this;
      local_60._M_current = _Var17._M_current;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                (this,_Var17,local_68,end,comp_03);
      local_48 = (pdqsort_detail *)((long)this + (uVar10 - 1) * 4);
      comp_04.r = pHVar15;
      comp_04.this = comp_00.this;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                ((pdqsort_detail *)((long)this + 4),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_48,
                 local_50,end,comp_04);
      piVar20 = (int *)((long)this + uVar10 * 4);
      comp_05.r = pHVar15;
      comp_05.this = comp_00.this;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                ((pdqsort_detail *)((long)this + 8),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)(piVar20 + 1),
                 local_58,end,comp_05);
      comp_06.r = pHVar15;
      comp_06.this = comp_00.this;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                (local_48,local_60,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)(piVar20 + 1),
                 end,comp_06);
      iVar3 = *(int *)this;
      *(int *)this = *piVar20;
      *piVar20 = iVar3;
    }
    if (((local_a4 & 1) == 0) &&
       (bVar8 = HighsCutGeneration::determineCover::anon_class_16_2_fd512ddf::operator()
                          (&comp_local,*(HighsInt *)((long)this + -4),*(HighsInt *)this), !bVar8)) {
      HVar4 = *(HighsInt *)this;
      lVar16 = 0;
      local_80.this = (HighsCutGeneration *)end._M_current;
      local_80.r = (HighsInt *)comp_00.this;
      do {
        bVar8 = HighsCutGeneration::determineCover::anon_class_16_2_fd512ddf::operator()
                          (&local_80,HVar4,*(HighsInt *)((long)begin._M_current + lVar16 + -4));
        lVar16 = lVar16 + -4;
      } while (bVar8);
      pHVar11 = (HighsInt *)((long)begin._M_current + lVar16);
      _Var17._M_current = (int *)this;
      if (lVar16 == -4) {
        do {
          if (pHVar11 <= _Var17._M_current) break;
          pHVar1 = _Var17._M_current + 1;
          _Var17._M_current = _Var17._M_current + 1;
          bVar8 = HighsCutGeneration::determineCover::anon_class_16_2_fd512ddf::operator()
                            (&local_80,HVar4,*pHVar1);
        } while (!bVar8);
      }
      else {
        do {
          pHVar1 = _Var17._M_current + 1;
          _Var17._M_current = _Var17._M_current + 1;
          bVar8 = HighsCutGeneration::determineCover::anon_class_16_2_fd512ddf::operator()
                            (&local_80,HVar4,*pHVar1);
        } while (!bVar8);
      }
      while (_Var17._M_current < pHVar11) {
        HVar5 = *_Var17._M_current;
        *_Var17._M_current = *pHVar11;
        *pHVar11 = HVar5;
        do {
          pHVar1 = pHVar11 + -1;
          pHVar11 = pHVar11 + -1;
          bVar8 = HighsCutGeneration::determineCover::anon_class_16_2_fd512ddf::operator()
                            (&local_80,HVar4,*pHVar1);
        } while (bVar8);
        do {
          pHVar1 = _Var17._M_current + 1;
          _Var17._M_current = _Var17._M_current + 1;
          bVar8 = HighsCutGeneration::determineCover::anon_class_16_2_fd512ddf::operator()
                            (&local_80,HVar4,*pHVar1);
        } while (!bVar8);
      }
      *(HighsInt *)this = *pHVar11;
      *pHVar11 = HVar4;
      this = (pdqsort_detail *)(pHVar11 + 1);
      goto LAB_0029442f;
    }
    HVar4 = *(HighsInt *)this;
    lVar16 = 0;
    local_80.this = (HighsCutGeneration *)end._M_current;
    local_80.r = (HighsInt *)comp_00.this;
    do {
      bVar8 = HighsCutGeneration::determineCover::anon_class_16_2_fd512ddf::operator()
                        (&local_80,*(HighsInt *)((long)this + lVar16 + 4),HVar4);
      lVar16 = lVar16 + 4;
    } while (bVar8);
    this_00 = (pdqsort_detail *)((long)this + lVar16);
    _Var17._M_current = begin._M_current;
    _Var7._M_current = (int *)this_00;
    if (lVar16 == 4) {
      do {
        ppVar18 = (pdqsort_detail *)_Var17._M_current;
        if (_Var17._M_current <= this_00) break;
        ppVar18 = (pdqsort_detail *)((long)_Var17._M_current + -4);
        _Var17._M_current = _Var17._M_current + -4;
        bVar8 = HighsCutGeneration::determineCover::anon_class_16_2_fd512ddf::operator()
                          (&local_80,*(HighsInt *)ppVar18,HVar4);
        ppVar18 = (pdqsort_detail *)_Var17._M_current;
      } while (!bVar8);
    }
    else {
      do {
        ppVar18 = (pdqsort_detail *)((long)_Var17._M_current + -4);
        _Var17._M_current = _Var17._M_current + -4;
        bVar8 = HighsCutGeneration::determineCover::anon_class_16_2_fd512ddf::operator()
                          (&local_80,*(HighsInt *)ppVar18,HVar4);
        ppVar18 = (pdqsort_detail *)_Var17._M_current;
      } while (!bVar8);
    }
    while (local_60._M_current = _Var7._M_current, this_00 < _Var17._M_current) {
      iVar3 = *(int *)this_00;
      *(int *)this_00 = *_Var17._M_current;
      *_Var17._M_current = iVar3;
      do {
        ppVar2 = this_00 + 4;
        this_00 = this_00 + 4;
        bVar8 = HighsCutGeneration::determineCover::anon_class_16_2_fd512ddf::operator()
                          (&local_80,*(HighsInt *)ppVar2,HVar4);
      } while (bVar8);
      do {
        ppVar2 = (pdqsort_detail *)((long)_Var17._M_current + -4);
        _Var17._M_current = _Var17._M_current + -4;
        bVar8 = HighsCutGeneration::determineCover::anon_class_16_2_fd512ddf::operator()
                          (&local_80,*(HighsInt *)ppVar2,HVar4);
        _Var7._M_current = local_60._M_current;
      } while (!bVar8);
    }
    _Var17._M_current = (int *)(this_00 + -4);
    *(int *)this = *(int *)(this_00 + -4);
    *(HighsInt *)(this_00 + -4) = HVar4;
    uVar9 = (long)_Var17._M_current - (long)this >> 2;
    uVar10 = (long)begin._M_current - (long)this_00 >> 2;
    if (((long)uVar9 < (long)(uVar12 >> 3)) || ((long)uVar10 < (long)(uVar12 >> 3))) {
      pHVar11 = (HighsInt *)(ulong)(uVar13 - 1);
      if (uVar13 - 1 == 0) {
        uVar10 = uVar12 - 2 >> 1;
        do {
          __comp._M_comp.r = (HighsInt *)comp_00.this;
          __comp._M_comp.this = (HighsCutGeneration *)end._M_current;
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCutGeneration::determineCover(bool)::__1>>
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this,uVar10,
                     uVar12,*(int *)((long)this + uVar10 * 4),__comp);
          bVar8 = uVar10 != 0;
          uVar10 = uVar10 - 1;
          piVar20 = local_70;
        } while (bVar8);
        while (_Var17._M_current = local_68._M_current, 4 < (long)piVar20) {
          iVar3 = *local_68._M_current;
          *local_68._M_current = *(int *)this;
          __comp_00._M_comp.r = (HighsInt *)comp_00.this;
          __comp_00._M_comp.this = (HighsCutGeneration *)end._M_current;
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCutGeneration::determineCover(bool)::__1>>
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this,0,
                     (long)(piVar20 + -1) >> 2,iVar3,__comp_00);
          local_68._M_current = _Var17._M_current + -1;
          piVar20 = piVar20 + -1;
        }
        return;
      }
      if (0x17 < (long)uVar9) {
        iVar3 = *(int *)this;
        uVar12 = uVar9 & 0xfffffffffffffffc;
        *(int *)this = *(int *)((long)this + uVar12);
        *(int *)((long)this + uVar12) = iVar3;
        uVar6 = *(undefined4 *)(this_00 + -8);
        *(undefined4 *)(this_00 + -8) = *(undefined4 *)(this_00 + (-4 - uVar12));
        *(undefined4 *)(this_00 + (-4 - uVar12)) = uVar6;
        if (0x80 < uVar9) {
          uVar9 = uVar9 >> 2;
          iVar3 = *(int *)((long)this + 4);
          *(int *)((long)this + 4) = *(int *)((long)this + (uVar9 + 1) * 4);
          *(int *)((long)this + (uVar9 + 1) * 4) = iVar3;
          iVar3 = *(int *)((long)this + 8);
          *(int *)((long)this + 8) = *(int *)((long)this + (uVar9 + 2) * 4);
          *(int *)((long)this + (uVar9 + 2) * 4) = iVar3;
          uVar6 = *(undefined4 *)(this_00 + -0xc);
          *(undefined4 *)(this_00 + -0xc) = *(undefined4 *)(this_00 + ~uVar9 * 4 + -4);
          *(undefined4 *)(this_00 + ~uVar9 * 4 + -4) = uVar6;
          uVar6 = *(undefined4 *)(this_00 + -0x10);
          *(undefined4 *)(this_00 + -0x10) = *(undefined4 *)(this_00 + (-2 - uVar9) * 4 + -4);
          *(undefined4 *)(this_00 + (-2 - uVar9) * 4 + -4) = uVar6;
        }
      }
      if (0x17 < (long)uVar10) {
        uVar12 = uVar10 & 0xfffffffffffffffc;
        uVar6 = *(undefined4 *)this_00;
        *(undefined4 *)this_00 = *(undefined4 *)(this_00 + uVar12);
        *(undefined4 *)(this_00 + uVar12) = uVar6;
        iVar3 = begin._M_current[-1];
        begin._M_current[-1] = *(begin._M_current - uVar12);
        *(begin._M_current - uVar12) = iVar3;
        if (0x80 < uVar10) {
          uVar10 = uVar10 >> 2;
          uVar6 = *(undefined4 *)(this_00 + 4);
          *(undefined4 *)(this_00 + 4) = *(undefined4 *)(this_00 + uVar10 * 4 + 4);
          *(undefined4 *)(this_00 + uVar10 * 4 + 4) = uVar6;
          uVar6 = *(undefined4 *)(this_00 + 8);
          *(undefined4 *)(this_00 + 8) = *(undefined4 *)(this_00 + uVar10 * 4 + 8);
          *(undefined4 *)(this_00 + uVar10 * 4 + 8) = uVar6;
          iVar3 = begin._M_current[-2];
          begin._M_current[-2] = begin._M_current[~uVar10];
          begin._M_current[~uVar10] = iVar3;
          iVar3 = begin._M_current[-3];
          begin._M_current[-3] = begin._M_current[-2 - uVar10];
          begin._M_current[-2 - uVar10] = iVar3;
        }
      }
    }
    else if (local_60._M_current < ppVar18) {
      pHVar11 = (HighsInt *)(ulong)uVar13;
    }
    else {
      comp_00.r = (HighsInt *)pHVar14;
      local_70 = _Var17._M_current;
      bVar8 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                        (this,_Var17,end,comp_00);
      if (bVar8) {
        comp_01.r = (HighsInt *)pHVar14;
        comp_01.this = comp_00.this;
        bVar8 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                          (this_00,begin,end,comp_01);
        pHVar11 = (HighsInt *)(ulong)uVar13;
        _Var17._M_current = local_70;
        if (bVar8) {
          return;
        }
      }
      else {
        pHVar11 = (HighsInt *)(ulong)uVar13;
        _Var17._M_current = local_70;
      }
    }
    pHVar15 = (HighsInt *)(ulong)(local_a4 & 1);
    uVar13 = (uint)pHVar11;
    comp_02.r = pHVar11;
    comp_02.this = comp_00.this;
    pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1,false>
              (this,_Var17,end,comp_02,local_a4 & 1,SUB81(pHVar11,0));
    local_a4 = 0;
    this = this_00;
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }